

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_util.hpp
# Opt level: O0

bool units::detail::pow_overflows(unit_data *a,int power)

{
  bool bVar1;
  undefined1 local_15;
  int power_local;
  unit_data *a_local;
  
  bVar1 = base_access<0>::times_overflows<units::detail::unit_data>(a,power);
  local_15 = true;
  if (!bVar1) {
    bVar1 = base_access<1>::times_overflows<units::detail::unit_data>(a,power);
    local_15 = true;
    if (!bVar1) {
      bVar1 = base_access<2>::times_overflows<units::detail::unit_data>(a,power);
      local_15 = true;
      if (!bVar1) {
        bVar1 = base_access<3>::times_overflows<units::detail::unit_data>(a,power);
        local_15 = true;
        if (!bVar1) {
          bVar1 = base_access<4>::times_overflows<units::detail::unit_data>(a,power);
          local_15 = true;
          if (!bVar1) {
            bVar1 = base_access<5>::times_overflows<units::detail::unit_data>(a,power);
            local_15 = true;
            if (!bVar1) {
              bVar1 = base_access<6>::times_overflows<units::detail::unit_data>(a,power);
              local_15 = true;
              if (!bVar1) {
                bVar1 = base_access<7>::times_overflows<units::detail::unit_data>(a,power);
                local_15 = true;
                if (!bVar1) {
                  bVar1 = base_access<8>::times_overflows<units::detail::unit_data>(a,power);
                  local_15 = true;
                  if (!bVar1) {
                    local_15 = base_access<9>::times_overflows<units::detail::unit_data>(a,power);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_15;
}

Assistant:

constexpr bool pow_overflows(const unit_data& a, const int power)
    {
        return (
            base_access<0>::times_overflows(a, power) ||
            base_access<1>::times_overflows(a, power) ||
            base_access<2>::times_overflows(a, power) ||
            base_access<3>::times_overflows(a, power) ||
            base_access<4>::times_overflows(a, power) ||
            base_access<5>::times_overflows(a, power) ||
            base_access<6>::times_overflows(a, power) ||
            base_access<7>::times_overflows(a, power) ||
            base_access<8>::times_overflows(a, power) ||
            base_access<9>::times_overflows(a, power));
    }